

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_edge_tec(REF_GEOM ref_geom,REF_INT edgeid,char *filename)

{
  uint uVar1;
  FILE *__s;
  undefined8 uVar2;
  char *pcVar3;
  int iVar4;
  REF_DBL t;
  REF_DBL trange [2];
  REF_DBL xyz [3];
  double local_60;
  double local_58;
  double local_50;
  REF_DBL local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x11ac,
           "ref_geom_edge_tec","unable to open file");
    uVar1 = 2;
  }
  else {
    fwrite("title=\"refine edge\"\n",0x14,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"t\"\n",0x1c,1,__s);
    uVar1 = ref_egads_edge_trange(ref_geom,edgeid,&local_58);
    if (uVar1 == 0) {
      iVar4 = 0;
      fprintf(__s,"zone t=\"edge%d\", i=%d, datapacking=%s\n",edgeid,0x3e9,"point");
      do {
        local_60 = (1.0 - (double)iVar4 / 1000.0) * local_58 + ((double)iVar4 / 1000.0) * local_50;
        uVar1 = ref_egads_eval_at(ref_geom,1,edgeid,&local_60,&local_48,(REF_DBL *)0x0);
        if (uVar1 != 0) {
          pcVar3 = "eval edge";
          uVar2 = 0x11b9;
          goto LAB_001b642f;
        }
        fprintf(__s,"%f %f %f %f\n",local_48,local_40,local_38,local_60);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x3e9);
      fclose(__s);
      uVar1 = 0;
    }
    else {
      pcVar3 = "trange";
      uVar2 = 0x11b1;
LAB_001b642f:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar2,
             "ref_geom_edge_tec",(ulong)uVar1,pcVar3);
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edge_tec(REF_GEOM ref_geom, REF_INT edgeid,
                                     const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, s0, s1;
  REF_DBL trange[2], xyz[3];
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine edge\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"t\"\n");

  RSS(ref_egads_edge_trange(ref_geom, edgeid, trange), "trange");
  fprintf(file, "zone t=\"edge%d\", i=%d, datapacking=%s\n", edgeid, n,
          "point");
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * trange[0] + s1 * trange[1];
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, edgeid, &t, xyz, NULL),
        "eval edge");
    fprintf(file, "%f %f %f %f\n", xyz[0], xyz[1], xyz[2], t);
  }
  fclose(file);
  return REF_SUCCESS;
}